

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::DeferCancelCall(cmMakefile *this,string *id)

{
  DeferCommands *pDVar1;
  pointer pDVar2;
  __type _Var3;
  DeferCommand *dc;
  pointer __lhs;
  vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_> *__range1;
  
  pDVar1 = (this->Defer)._M_t.
           super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
           .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl;
  if (pDVar1 != (DeferCommands *)0x0) {
    pDVar2 = *(pointer *)
              ((long)&(pDVar1->Commands).
                      super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
              + 8);
    for (__lhs = *(pointer *)
                  &(pDVar1->Commands).
                   super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
        ; __lhs != pDVar2; __lhs = __lhs + 1) {
      _Var3 = std::operator==(&__lhs->Id,id);
      if (_Var3) {
        (__lhs->Id)._M_string_length = 0;
        *(__lhs->Id)._M_dataplus._M_p = '\0';
      }
    }
  }
  return pDVar1 != (DeferCommands *)0x0;
}

Assistant:

Message::LogLevel cmMakefile::GetCurrentLogLevel() const
{
  const cmake* cmakeInstance = this->GetCMakeInstance();

  const Message::LogLevel logLevelCliOrDefault = cmakeInstance->GetLogLevel();
  assert("Expected a valid log level here" &&
         logLevelCliOrDefault != Message::LogLevel::LOG_UNDEFINED);

  Message::LogLevel result = logLevelCliOrDefault;

  // If the log-level was set via the command line option, it takes precedence
  // over the CMAKE_MESSAGE_LOG_LEVEL variable.
  if (!cmakeInstance->WasLogLevelSetViaCLI()) {
    const Message::LogLevel logLevelFromVar = cmake::StringToLogLevel(
      this->GetSafeDefinition("CMAKE_MESSAGE_LOG_LEVEL"));
    if (logLevelFromVar != Message::LogLevel::LOG_UNDEFINED) {
      result = logLevelFromVar;
    }
  }

  return result;
}